

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Player.cpp
# Opt level: O2

void __thiscall Player::prepareForBattle(Player *this)

{
  bool bVar1;
  list<BlackCard_*,_std::allocator<BlackCard_*>_> *__x;
  ostream *poVar2;
  _List_node_base *p_Var3;
  char ans;
  list<BlackCard_*,_std::allocator<BlackCard_*>_> arm;
  
  __x = DynastyDeck::getDynDeck_abi_cxx11_(&this->army);
  std::__cxx11::list<BlackCard_*,_std::allocator<BlackCard_*>_>::list(&arm,__x);
  p_Var3 = (_List_node_base *)&arm;
  while (p_Var3 = (((_List_base<BlackCard_*,_std::allocator<BlackCard_*>_> *)&p_Var3->_M_next)->
                  _M_impl)._M_node.super__List_node_base._M_next, p_Var3 != (_List_node_base *)&arm)
  {
    bVar1 = BlackCard::isTapped((BlackCard *)p_Var3[1]._M_next);
    if (!bVar1) {
      BlackCard::PrintCardStats((BlackCard *)p_Var3[1]._M_next);
      poVar2 = std::operator<<((ostream *)&std::cout,"Do you want to use this personality?");
      poVar2 = std::endl<char,std::char_traits<char>>(poVar2);
      poVar2 = std::operator<<(poVar2,"y for yes, n for no");
      std::endl<char,std::char_traits<char>>(poVar2);
      std::operator>>((istream *)&std::cin,&ans);
      if (ans == 'y') {
        BlackCard::setTapped((BlackCard *)p_Var3[1]._M_next,true);
      }
    }
  }
  std::__cxx11::_List_base<BlackCard_*,_std::allocator<BlackCard_*>_>::_M_clear
            (&arm.super__List_base<BlackCard_*,_std::allocator<BlackCard_*>_>);
  return;
}

Assistant:

void Player::prepareForBattle()                                                 //activates any untapped personalities the player wants for attack
{
    char ans;

    list<BlackCard*> arm = army.getDynDeck();
    list<BlackCard*>::iterator it;

    for (it=arm.begin(); it!=arm.end(); it++)
    {
        if ((*it)->isTapped())                         //tapped means busy somewhere else
            continue;

        (*it)->PrintCardStats();
        cout << "Do you want to use this personality?"<<endl<<"y for yes, n for no"<<endl;
        cin >> ans;

        if (ans == 'y')
            (*it)->setTapped(true);             //every tapped personality will attack
    }
}